

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int check_instid_ext_dep(lys_node *sleaf,char *json_instid)

{
  lys_node *plVar1;
  char *pcVar2;
  lys_module *plVar3;
  lys_module *plVar4;
  bool bVar5;
  size_t local_60;
  char *tmp;
  char *buf;
  lys_node *plStack_30;
  int_log_opts prev_ilo;
  lys_node *first_node;
  lys_node *op_node;
  char *json_instid_local;
  lys_node *sleaf_local;
  
  if ((json_instid == (char *)0x0) || (*json_instid == '\0')) {
    sleaf_local._4_4_ = 0;
  }
  else {
    op_node = (lys_node *)json_instid;
    json_instid_local = (char *)sleaf;
    first_node = lys_parent(sleaf);
    while( true ) {
      bVar5 = false;
      if (first_node != (lys_node *)0x0) {
        bVar5 = (first_node->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN;
      }
      if (!bVar5) break;
      first_node = lys_parent(first_node);
    }
    if ((first_node == (lys_node *)0x0) ||
       (plVar1 = lys_parent(first_node), plVar1 == (lys_node *)0x0)) {
      pcVar2 = strchr((char *)((long)&op_node->name + 1),0x2f);
      plVar1 = op_node;
      if (pcVar2 == (char *)0x0) {
        local_60 = strlen((char *)op_node);
      }
      else {
        local_60 = (long)pcVar2 - (long)op_node;
      }
      pcVar2 = strndup((char *)plVar1,local_60);
      if (pcVar2 == (char *)0x0) {
        sleaf_local._4_4_ = 0;
      }
      else {
        ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,(int_log_opts *)((long)&buf + 4),(ly_err_item **)0x0)
        ;
        plStack_30 = ly_ctx_get_node((ly_ctx *)0x0,(lys_node *)json_instid_local,pcVar2,0);
        ly_ilo_restore((ly_ctx *)0x0,buf._4_4_,(ly_err_item *)0x0,0);
        free(pcVar2);
        if (plStack_30 == (lys_node *)0x0) {
          sleaf_local._4_4_ = 1;
        }
        else {
          if (first_node == (lys_node *)0x0) {
            plVar3 = lys_node_module((lys_node *)json_instid_local);
            plVar4 = lys_node_module(plStack_30);
            if (plVar3 != plVar4) {
              return 1;
            }
          }
          else if (first_node != plStack_30) {
            return 1;
          }
          sleaf_local._4_4_ = 0;
        }
      }
    }
    else {
      sleaf_local._4_4_ = 1;
    }
  }
  return sleaf_local._4_4_;
}

Assistant:

static int
check_instid_ext_dep(const struct lys_node *sleaf, const char *json_instid)
{
    const struct lys_node *op_node, *first_node;
    enum int_log_opts prev_ilo;
    char *buf, *tmp;

    if (!json_instid || !json_instid[0]) {
        /* no/empty value */
        return 0;
    }

    for (op_node = lys_parent(sleaf);
         op_node && !(op_node->nodetype & (LYS_NOTIF | LYS_RPC | LYS_ACTION));
         op_node = lys_parent(op_node));

    if (op_node && lys_parent(op_node)) {
        /* nested operation - any absolute path is external */
        return 1;
    }

    /* get the first node from the instid */
    tmp = strchr(json_instid + 1, '/');
    buf = strndup(json_instid, tmp ? (size_t)(tmp - json_instid) : strlen(json_instid));
    if (!buf) {
        /* so that we do not have to bother with logging, say it is not external */
        return 0;
    }

    /* find the first schema node, do not log */
    ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, NULL);
    first_node = ly_ctx_get_node(NULL, sleaf, buf, 0);
    ly_ilo_restore(NULL, prev_ilo, NULL, 0);

    free(buf);
    if (!first_node) {
        /* unknown path, say it is external */
        return 1;
    }

    /* based on the first schema node in the path we can decide whether it points to an external tree or not */

    if (op_node) {
        if (op_node != first_node) {
            /* it is a top-level operation, so we're good if it points somewhere inside it */
            return 1;
        }
    } else {
        if (lys_node_module(sleaf) != lys_node_module(first_node)) {
            /* modules differ */
            return 1;
        }
    }

    return 0;
}